

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

AssertionResult * __thiscall
iutest::internal::CmpHelperEQ<std::basic_string_view<char,std::char_traits<char>>,char[4]>
          (AssertionResult *__return_storage_ptr__,internal *this,char *expected_str,
          char *actual_str,basic_string_view<char,_std::char_traits<char>_> *expected,
          char (*actual) [4])

{
  basic_string_view<char,_std::char_traits<char>_> *actual_expression;
  char *expected_expression;
  bool bVar1;
  string local_70;
  string local_50;
  basic_string_view<char,_std::char_traits<char>_> *local_30;
  char (*actual_local) [4];
  basic_string_view<char,_std::char_traits<char>_> *expected_local;
  char *actual_str_local;
  char *expected_str_local;
  
  local_30 = expected;
  actual_local = (char (*) [4])actual_str;
  expected_local = (basic_string_view<char,_std::char_traits<char>_> *)expected_str;
  actual_str_local = (char *)this;
  expected_str_local = (char *)__return_storage_ptr__;
  bVar1 = iuOperatorEQ<char[4],std::basic_string_view<char,std::char_traits<char>>>
                    ((char (*) [4])expected,
                     (basic_string_view<char,_std::char_traits<char>_> *)actual_str);
  expected_expression = actual_str_local;
  actual_expression = expected_local;
  if (bVar1) {
    AssertionSuccess();
  }
  else {
    FormatForComparisonFailureMessage<std::basic_string_view<char,std::char_traits<char>>,char[4]>
              (&local_50,(internal *)actual_local,local_30,(char (*) [4])actual_str);
    FormatForComparisonFailureMessage<char[4],std::basic_string_view<char,std::char_traits<char>>>
              (&local_70,(internal *)local_30,actual_local,
               (basic_string_view<char,_std::char_traits<char>_> *)actual_str);
    EqFailure(__return_storage_ptr__,expected_expression,(char *)actual_expression,&local_50,
              &local_70,false);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

IUTEST_COND_LIKELY( iuOperatorEQ(actual, expected) )
    {
        return AssertionSuccess();
    }